

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O3

bool __thiscall cmCTestVC::Update(cmCTestVC *this)

{
  cmCTest *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  string local_68;
  string local_48;
  
  this_00 = this->CTest;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"UpdateVersionOnly","");
  cmCTest::GetCTestConfiguration(&local_48,this_00,&local_68);
  bVar1 = cmSystemTools::IsOn(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  bVar4 = 1;
  if (!bVar1) {
    iVar2 = (*this->_vptr_cmCTestVC[3])(this);
    std::__ostream_insert<char,std::char_traits<char>>(this->Log,"--- Begin Update ---\n",0x15);
    iVar3 = (*this->_vptr_cmCTestVC[4])(this);
    bVar4 = (byte)iVar3 & (byte)iVar2;
    std::__ostream_insert<char,std::char_traits<char>>(this->Log,"--- End Update ---\n",0x13);
  }
  iVar2 = (*this->_vptr_cmCTestVC[5])(this);
  return (bool)((byte)iVar2 & bVar4);
}

Assistant:

bool cmCTestVC::Update()
{
  bool result = true;
  // if update version only is on then do not actually update,
  // just note the current version and finish
  if (!cmSystemTools::IsOn(
        this->CTest->GetCTestConfiguration("UpdateVersionOnly"))) {
    result = this->NoteOldRevision() && result;
    this->Log << "--- Begin Update ---\n";
    result = this->UpdateImpl() && result;
    this->Log << "--- End Update ---\n";
  }
  result = this->NoteNewRevision() && result;
  return result;
}